

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec
          (GpuCounterDescriptor_GpuCounterSpec *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_GpuCounterSpec_003a0f58;
  this->counter_id_ = 0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->description_)._M_dataplus._M_p = (pointer)&(this->description_).field_2;
  (this->description_)._M_string_length = 0;
  (this->description_).field_2._M_local_buf[0] = '\0';
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->groups_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->int_peak_value_ = 0;
  this->double_peak_value_ = 0.0;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->numerator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->denominator_units_).
  super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->select_by_default_ = false;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

GpuCounterDescriptor_GpuCounterSpec::GpuCounterDescriptor_GpuCounterSpec() = default;